

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O2

ans_fold_decode<4U> *
ans_fold_decode<4U>::load(ans_fold_decode<4U> *__return_storage_ptr__,uint8_t *in_u8)

{
  vector<dec_entry_fold,_std::allocator<dec_entry_fold>_> *this;
  uint uVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  uint x_plus_offset;
  int iVar4;
  uint32_t uVar5;
  pointer puVar6;
  uint64_t uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [64];
  undefined1 in_XMM1 [16];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  undefined1 extraout_var [56];
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ans_load_interp((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,in_u8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  std::
  __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  this = &__return_storage_ptr__->table;
  iVar9 = 0;
  for (puVar6 = (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 != (__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
    iVar9 = iVar9 + *puVar6;
  }
  uVar7 = (uint64_t)iVar9;
  auVar3 = vcvtusi2sd_avx512f(in_XMM1,uVar7);
  __return_storage_ptr__->frame_size = uVar7;
  __return_storage_ptr__->frame_mask = uVar7 - 1;
  auVar13._0_8_ = log2(auVar3._0_8_);
  auVar13._8_56_ = extraout_var;
  uVar7 = vcvttsd2usi_avx512f(auVar13._0_16_);
  __return_storage_ptr__->frame_log2 = uVar7;
  std::vector<dec_entry_fold,_std::allocator<dec_entry_fold>_>::resize
            (this,__return_storage_ptr__->frame_size);
  puVar6 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar9 = 0;
  lVar8 = (long)(__return_storage_ptr__->nfreqs).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar6;
  for (uVar10 = 0; uVar10 <= (lVar8 >> 2) - 1U; uVar10 = uVar10 + 1) {
    x_plus_offset = (uint)uVar10;
    uVar1 = puVar6[uVar10];
    iVar4 = ((x_plus_offset - 0x800) / 0x7f8) * 0x40000000 + 0x40000000;
    if (x_plus_offset < 0x800) {
      iVar4 = 0;
    }
    for (uVar11 = 0; uVar1 != uVar11; uVar11 = uVar11 + 1) {
      uVar12 = iVar9 + (int)uVar11;
      (this->super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar12].freq = (uint16_t)uVar1;
      uVar5 = ans_fold_undo_mapping<4u>(x_plus_offset);
      pdVar2 = (this->super__Vector_base<dec_entry_fold,_std::allocator<dec_entry_fold>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2[uVar12].mapped_num = uVar5 + iVar4;
      pdVar2[uVar12].offset = (uint16_t)uVar11;
    }
    puVar6 = (__return_storage_ptr__->nfreqs).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar9 = iVar9 + puVar6[uVar10];
  }
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  return __return_storage_ptr__;
}

Assistant:

static ans_fold_decode load(const uint8_t* in_u8)
    {
        ans_fold_decode model;
        model.nfreqs = ans_load_interp(in_u8);
        auto max_norm_freq
            = *std::max_element(model.nfreqs.begin(), model.nfreqs.end());
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        model.frame_mask = model.frame_size - 1;
        model.frame_log2 = log2(model.frame_size);
        model.table.resize(model.frame_size);
        auto max_sym = model.nfreqs.size() - 1;
        uint64_t tmp = constants::K * constants::RADIX;
        uint32_t cur_base = 0;
        for (size_t sym = 0; sym <= max_sym; sym++) {
            auto cur_freq = model.nfreqs[sym];
            for (uint32_t k = 0; k < cur_freq; k++) {
                model.table[cur_base + k].freq = cur_freq;
                uint32_t except_bytes = ans_fold_exception_bytes<fidelity>(sym);
                model.table[cur_base + k].mapped_num
                    = ans_fold_undo_mapping<fidelity>(sym)
                    + (except_bytes << 30);
                model.table[cur_base + k].offset = k;
            }
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }